

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O0

int Gia_ManCountConst0PosGia(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar2 = false;
    if (local_1c < iVar1) {
      _Counter = Gia_ManCo(p,local_1c);
      bVar2 = _Counter != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjFaninLit0p(p,_Counter);
    local_20 = (uint)(iVar1 == 0) + local_20;
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Gia_ManCountConst0PosGia( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachPo( p, pObj, i )
        Counter += (Gia_ObjFaninLit0p(p, pObj) == 0);
    return Counter;
}